

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O0

LispPTR bitblt_bitmap(LispPTR *args)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  LispPTR LVar5;
  LispPTR LVar6;
  int iVar7;
  int iVar8;
  int w;
  uint x;
  uint uVar9;
  LispPTR *pLVar10;
  LispPTR *pLVar11;
  LispPTR *pLVar12;
  sbyte sVar13;
  int iVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  uint local_294;
  int local_290;
  uint local_28c;
  uint local_288;
  uint local_284;
  uint local_228;
  int local_224;
  uint local_220;
  uint local_21c;
  uint local_218;
  undefined4 local_214;
  undefined4 local_210;
  uint local_200;
  uint local_1fc;
  int local_1f8;
  uint local_1f0;
  uint local_1ec;
  int local_1e8;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  uint local_1d0;
  uint local_1cc;
  int local_1c8;
  int local_1c0;
  LispPTR local_1bc;
  int local_1b8;
  LispPTR local_1b4;
  uint local_1b0;
  uint local_1a8;
  LispPTR local_1a0;
  LispPTR local_198;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  uint local_150;
  int srcRshift;
  uint newS;
  uint savedS;
  uint shS;
  uint *src32addr;
  uint *dst32addr;
  uint sdw_mask;
  uint postloop_mask;
  uint preloop_mask;
  int bb_fast;
  uint *OrigDstAddr;
  uint *OrigSrcAddr;
  int fwd;
  int src32rbit;
  int dst32rbit;
  int abc;
  UNSIGNED x32ia;
  UNSIGNED x32nbyt;
  UNSIGNED x32byta;
  uint mask;
  uint dstdata;
  uint dstold;
  uint srcRmask;
  int dst32lbit;
  int srcLshift;
  int src32lbit;
  int dstnumL;
  int num_lines_remaining;
  int temp_1;
  int cr_bot;
  int cr_left;
  int temp;
  LispPTR clipvalue;
  int displayflg;
  int backwardflg;
  int src_comp;
  int op;
  int dstbpl;
  int srcbpl;
  int sty;
  int slx;
  int dty;
  int dlx;
  DLword *dstbase;
  DLword *srcbase;
  LispPTR texture;
  LispPTR operation;
  LispPTR sourcetype;
  int bottom;
  int left;
  int sourcebits;
  int destbits;
  int top;
  int right;
  int stody;
  int stodx;
  LispPTR clipreg;
  int clipbottom;
  int clipleft;
  int height;
  int width;
  int dbottom;
  int dleft;
  int sbottom;
  int sleft;
  BITMAP *DestBitmap;
  BITMAP *SourceBitmap;
  LispPTR *args_local;
  sbyte sVar14;
  
  bVar4 = false;
  if (kbd_for_makeinit == 0) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }
  pLVar10 = NativeAligned4FromLAddr(*args);
  pLVar11 = NativeAligned4FromLAddr(args[3]);
  if (((short)pLVar11[2] != 1) || ((short)pLVar10[2] != 1)) {
    if ((BITBLTBITMAP_index == 0xffffffff) &&
       (BITBLTBITMAP_index = get_package_atom("\\PUNT.BITBLT.BITMAP",0x13,"INTERLISP",9,0),
       BITBLTBITMAP_index == 0xffffffff)) {
      error("BITBLTBITMAP install failed");
      return 0;
    }
    MachineState.csp = MachineState.csp + 0x1a;
    ccfuncall(BITBLTBITMAP_index,0xe,3);
    return 0x4c;
  }
  uVar9 = args[8];
  if (uVar9 == MERGE_atom) {
    if ((BITBLTBITMAP_index == 0xffffffff) &&
       (BITBLTBITMAP_index = get_package_atom("\\PUNT.BITBLT.BITMAP",0x13,"INTERLISP",9,0),
       BITBLTBITMAP_index == 0xffffffff)) {
      error("BITBLTBITMAP install failed");
      return 0;
    }
    MachineState.csp = MachineState.csp + 0x1a;
    ccfuncall(BITBLTBITMAP_index,0xe,3);
    return 0x4c;
  }
  if ((args[1] & 0xfff0000) == 0xe0000) {
    dleft = args[1] & 0xffff;
LAB_00111b98:
    if ((args[2] & 0xfff0000) == 0xe0000) {
      dbottom = args[2] & 0xffff;
    }
    else if ((args[2] & 0xfff0000) == 0xf0000) {
      dbottom = args[2] | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (args[2] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
      pLVar12 = NativeAligned4FromLAddr(args[2]);
      dbottom = *pLVar12;
    }
    if ((args[4] & 0xfff0000) == 0xe0000) {
      width = args[4] & 0xffff;
    }
    else if ((args[4] & 0xfff0000) == 0xf0000) {
      width = args[4] | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (args[4] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
      pLVar12 = NativeAligned4FromLAddr(args[4]);
      width = *pLVar12;
    }
    if ((args[5] & 0xfff0000) == 0xe0000) {
      height = args[5] & 0xffff;
    }
    else if ((args[5] & 0xfff0000) == 0xf0000) {
      height = args[5] | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (args[5] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
      pLVar12 = NativeAligned4FromLAddr(args[5]);
      height = *pLVar12;
    }
    if ((args[6] & 0xfff0000) == 0xe0000) {
      clipleft = args[6] & 0xffff;
    }
    else if ((args[6] & 0xfff0000) == 0xf0000) {
      clipleft = args[6] | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (args[6] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
      pLVar12 = NativeAligned4FromLAddr(args[6]);
      clipleft = *pLVar12;
    }
    if ((args[7] & 0xfff0000) == 0xe0000) {
      clipbottom = args[7] & 0xffff;
    }
    else if ((args[7] & 0xfff0000) == 0xf0000) {
      clipbottom = args[7] | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (args[7] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
      pLVar12 = NativeAligned4FromLAddr(args[7]);
      clipbottom = *pLVar12;
    }
    uVar3 = args[9];
    LVar6 = args[0xb];
    if ((args[0xc] & 0xfff0000) == 0xe0000) {
      clipreg = args[0xc] & 0xffff;
    }
    else if ((args[0xc] & 0xfff0000) == 0xf0000) {
      clipreg = args[0xc] | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (args[0xc] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
      pLVar12 = NativeAligned4FromLAddr(args[0xc]);
      clipreg = *pLVar12;
    }
    if ((args[0xd] & 0xfff0000) == 0xe0000) {
      stodx = args[0xd] & 0xffff;
    }
    else if ((args[0xd] & 0xfff0000) == 0xf0000) {
      stodx = args[0xd] | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (args[0xd] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
      pLVar12 = NativeAligned4FromLAddr(args[0xd]);
      stodx = *pLVar12;
    }
    operation = 0;
    sourcetype = 0;
    local_1b0 = (uint)(ushort)pLVar11[1];
    local_1a8 = (uint)*(ushort *)((long)pLVar11 + 10);
    sourcebits = local_1b0;
    destbits = local_1a8;
    if (LVar6 != 0) {
      LVar5 = car(LVar6);
      if ((LVar5 & 0xfff0000) == 0xe0000) {
        temp_1 = LVar5 & 0xffff;
      }
      else if ((LVar5 & 0xfff0000) == 0xf0000) {
        temp_1 = LVar5 | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (LVar5 >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
        pLVar12 = NativeAligned4FromLAddr(LVar5);
        temp_1 = *pLVar12;
      }
      if (temp_1 < 0) {
        local_198 = 0;
      }
      else {
        local_198 = temp_1;
      }
      sourcetype = local_198;
      LVar6 = cdr(LVar6);
      LVar5 = car(LVar6);
      if ((LVar5 & 0xfff0000) == 0xe0000) {
        num_lines_remaining = LVar5 & 0xffff;
      }
      else if ((LVar5 & 0xfff0000) == 0xf0000) {
        num_lines_remaining = LVar5 | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (LVar5 >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
        pLVar12 = NativeAligned4FromLAddr(LVar5);
        num_lines_remaining = *pLVar12;
      }
      if (num_lines_remaining < 0) {
        local_1a0 = 0;
      }
      else {
        local_1a0 = num_lines_remaining;
      }
      operation = local_1a0;
      LVar6 = cdr(LVar6);
      LVar5 = car(LVar6);
      if ((LVar5 & 0xfff0000) == 0xe0000) {
        cr_bot = LVar5 & 0xffff;
      }
      else if ((LVar5 & 0xfff0000) == 0xf0000) {
        cr_bot = LVar5 | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (LVar5 >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
        pLVar12 = NativeAligned4FromLAddr(LVar5);
        cr_bot = *pLVar12;
      }
      if (temp_1 + cr_bot <= (int)local_1a8) {
        local_1a8 = temp_1 + cr_bot;
      }
      destbits = local_1a8;
      LVar6 = cdr(LVar6);
      LVar6 = car(LVar6);
      if ((LVar6 & 0xfff0000) == 0xe0000) {
        cr_bot = LVar6 & 0xffff;
      }
      else if ((LVar6 & 0xfff0000) == 0xf0000) {
        cr_bot = LVar6 | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (LVar6 >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00114d20;
        pLVar12 = NativeAligned4FromLAddr(LVar6);
        cr_bot = *pLVar12;
      }
      if (num_lines_remaining + cr_bot <= (int)local_1b0) {
        local_1b0 = num_lines_remaining + cr_bot;
      }
      sourcebits = local_1b0;
    }
    if (width < (int)sourcetype) {
      local_1b4 = sourcetype;
    }
    else {
      local_1b4 = width;
    }
    if (destbits < width + clipleft) {
      local_1b8 = destbits;
    }
    else {
      local_1b8 = width + clipleft;
    }
    if (height < (int)operation) {
      local_1bc = operation;
    }
    else {
      local_1bc = height;
    }
    if (sourcebits < height + clipbottom) {
      local_1c0 = sourcebits;
    }
    else {
      local_1c0 = height + clipbottom;
    }
    iVar7 = height - dbottom;
    iVar8 = width - dleft;
    if ((int)(local_1b4 - iVar8) < 0) {
      local_1c8 = 0;
    }
    else {
      local_1c8 = local_1b4 - iVar8;
    }
    if (local_1c8 < (int)clipreg) {
      local_1cc = clipreg;
    }
    else {
      if ((int)(local_1b4 - iVar8) < 0) {
        local_1d0 = 0;
      }
      else {
        local_1d0 = local_1b4 - iVar8;
      }
      local_1cc = local_1d0;
    }
    if ((int)(local_1bc - iVar7) < 0) {
      local_1d8 = 0;
    }
    else {
      local_1d8 = local_1bc - iVar7;
    }
    if (local_1d8 < stodx) {
      local_1dc = stodx;
    }
    else {
      if ((int)(local_1bc - iVar7) < 0) {
        local_1e0 = 0;
      }
      else {
        local_1e0 = local_1bc - iVar7;
      }
      local_1dc = local_1e0;
    }
    local_1ec = (uint)*(ushort *)((long)pLVar10 + 10);
    if (local_1b8 - iVar8 < (int)(clipreg + clipleft)) {
      local_1e8 = local_1b8 - iVar8;
    }
    else {
      local_1e8 = clipreg + clipleft;
    }
    if (local_1e8 <= (int)local_1ec) {
      if (local_1b8 - iVar8 < (int)(clipreg + clipleft)) {
        local_1f0 = local_1b8 - iVar8;
      }
      else {
        local_1f0 = clipreg + clipleft;
      }
      local_1ec = local_1f0;
    }
    local_1fc = (uint)(ushort)pLVar10[1];
    if (local_1c0 - iVar7 < stodx + clipbottom) {
      local_1f8 = local_1c0 - iVar7;
    }
    else {
      local_1f8 = stodx + clipbottom;
    }
    if (local_1f8 <= (int)local_1fc) {
      if (local_1c0 - iVar7 < stodx + clipbottom) {
        local_200 = local_1c0 - iVar7;
      }
      else {
        local_200 = stodx + clipbottom;
      }
      local_1fc = local_200;
    }
    if (((int)local_1cc < (int)local_1ec) && (local_1dc < (int)local_1fc)) {
      local_1dc = local_1fc - local_1dc;
      w = local_1ec - local_1cc;
      iVar7 = (uint)(ushort)pLVar11[1] - (local_1fc + iVar7);
      x = local_1cc + iVar8;
      iVar8 = (ushort)pLVar10[1] - local_1fc;
      if (uVar9 == INVERT_atom) {
        bVar17 = uVar3 != ERASE_atom;
      }
      else {
        bVar17 = uVar3 == ERASE_atom;
      }
      if (uVar3 == PAINT_atom) {
        local_210 = 2;
      }
      else {
        if (uVar3 == ERASE_atom) {
          local_214 = 1;
        }
        else {
          local_214 = 0;
          if (uVar3 == INVERT_atom) {
            local_214 = 3;
          }
        }
        local_210 = local_214;
      }
      uVar1 = *(ushort *)((long)pLVar11 + 6);
      src_comp = (uint)uVar1 * 0x10;
      uVar2 = *(ushort *)((long)pLVar10 + 6);
      op = (uint)uVar2 * 0x10;
      if ((((pLVar10 == pLVar11) && (iVar8 <= iVar7)) && (iVar7 <= iVar8 + local_1dc)) &&
         ((iVar8 != iVar7 || (((int)local_1cc < (int)x && ((int)x < (int)(local_1cc + w))))))) {
        bVar4 = true;
      }
      if (bVar4) {
        dstbase = NativeAligned2FromLAddr
                            (*pLVar10 +
                             (uint)*(ushort *)((long)pLVar10 + 6) * (iVar8 + local_1dc + -1));
        _dty = NativeAligned2FromLAddr
                         (*pLVar11 + (uint)*(ushort *)((long)pLVar11 + 6) * (iVar7 + local_1dc + -1)
                         );
        op = (uint)uVar2 * -0x10;
        src_comp = (uint)uVar1 * -0x10;
      }
      else {
        dstbase = NativeAligned2FromLAddr(*pLVar10 + (uint)*(ushort *)((long)pLVar10 + 6) * iVar8);
        _dty = NativeAligned2FromLAddr(*pLVar11 + (uint)*(ushort *)((long)pLVar11 + 6) * iVar7);
      }
      n_new_cursorin(dstbase,local_1cc,iVar8,w,local_1dc);
      ScreenLocked = 1;
      srcRshift = 0;
      bVar18 = ((op | src_comp) & 0x1fU) != 0;
      if (bVar4) {
        uVar9 = (x + w) - 1;
        if ((int)uVar9 < 0) {
          lVar16 = -(long)((int)(7 - uVar9) >> 3);
        }
        else {
          lVar16 = (long)((int)uVar9 >> 3);
        }
        x32nbyt = (long)_dty + lVar16;
        _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
        fwd = (int)((x32nbyt & 3) << 3) + (uVar9 & 7);
        dstold = (fwd - w) + 1U & 0x1f;
        sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
        if (dstold == 0) {
          local_220 = 0xffffffff;
        }
        else {
          local_220 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        dst32addr._4_4_ = local_220;
        dst32addr._0_4_ = sdw_mask & local_220;
        if ((w - fwd) + -1 < 1) {
          local_224 = 0;
        }
        else {
          local_224 = (w - fwd) + -1 >> 5;
        }
        srcLshift = local_224;
        uVar9 = (local_1cc + w) - 1;
        if ((int)uVar9 < 0) {
          lVar16 = -(long)((int)(7 - uVar9) >> 3);
        }
        else {
          lVar16 = (long)((int)uVar9 >> 3);
        }
        x32nbyt = (long)dstbase + lVar16;
        OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
        OrigSrcAddr._4_4_ = (int)((x32nbyt & 3) << 3) + (uVar9 & 7);
        dst32lbit = (OrigSrcAddr._4_4_ - w) + 1 & 0x1f;
        local_150 = dstold - dst32lbit;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_228 = 0;
        }
        else {
          local_228 = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_228;
      }
      else {
        if ((int)x < 0) {
          lVar16 = -(long)((int)(7 - x) >> 3);
        }
        else {
          lVar16 = (long)((int)x >> 3);
        }
        x32nbyt = (long)_dty + lVar16;
        _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
        dstold = (int)((x32nbyt & 3) << 3) + (x & 7);
        fwd = (dstold + w) - 1 & 0x1f;
        if (dstold == 0) {
          local_218 = 0xffffffff;
        }
        else {
          local_218 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        sdw_mask = local_218;
        dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
        dst32addr._0_4_ = local_218 & dst32addr._4_4_;
        srcLshift = ((int)(dstold + w) >> 5) + -1;
        if ((int)local_1cc < 0) {
          lVar16 = -(long)((int)(7 - local_1cc) >> 3);
        }
        else {
          lVar16 = (long)((int)local_1cc >> 3);
        }
        x32nbyt = (long)dstbase + lVar16;
        OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
        dst32lbit = (int)((x32nbyt & 3) << 3) + (local_1cc & 7);
        OrigSrcAddr._4_4_ = (dst32lbit + w) - 1U & 0x1f;
        local_150 = dstold - dst32lbit;
        srcRmask = dst32lbit - dstold & 0x1f;
        if (srcRmask == 0) {
          local_21c = 0xffffffff;
        }
        else {
          local_21c = -1 << (sbyte)srcRmask ^ 0xffffffff;
        }
        dstdata = local_21c;
      }
      local_150 = local_150 & 0x1f;
      src32lbit = local_1dc;
      while( true ) {
        src32addr = _preloop_mask;
        if (src32lbit < 1) break;
        sVar13 = (sbyte)local_150;
        sVar14 = (sbyte)srcRmask;
        if (bVar4) {
          if ((OrigSrcAddr._4_4_ < (uint)fwd) && ((int)(dstold + 1) < dst32lbit + w)) {
            _savedS = OrigDstAddr + -2;
            newS = *OrigDstAddr >> sVar13 & dstdata | OrigDstAddr[-1] << sVar14;
            srcRshift = OrigDstAddr[-1] >> sVar13 & dstdata;
          }
          else {
            if (OrigSrcAddr._4_4_ < (uint)fwd) {
              newS = *OrigDstAddr >> sVar13 & dstdata;
            }
            else {
              newS = *OrigDstAddr << sVar14;
              srcRshift = *OrigDstAddr >> sVar13 & dstdata;
            }
            _savedS = OrigDstAddr + -1;
          }
          if (bVar17) {
            newS = newS ^ 0xffffffff;
          }
          if ((int)(dstold + w) < 0x21) {
            x32byta._0_4_ = (uint)dst32addr;
          }
          else {
            x32byta._4_4_ = *_preloop_mask;
            uVar9 = x32byta._4_4_ & ~sdw_mask;
            switch(local_210) {
            case 0:
              x32byta._4_4_ = newS;
              break;
            case 1:
              x32byta._4_4_ = newS & x32byta._4_4_;
              break;
            case 2:
              x32byta._4_4_ = newS | x32byta._4_4_;
              break;
            case 3:
              x32byta._4_4_ = newS ^ x32byta._4_4_;
            }
            *_preloop_mask = uVar9 | sdw_mask & x32byta._4_4_;
            src32addr = _preloop_mask + -1;
            if (dst32lbit == dstold) {
              if (bVar17) {
                switch(local_210) {
                case 0:
                  local_164 = srcLshift;
                  while (local_164 = local_164 + -1, -1 < local_164) {
                    *src32addr = *_savedS ^ 0xffffffff;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 1:
                  local_164 = srcLshift;
                  while (local_164 = local_164 + -1, -1 < local_164) {
                    *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 2:
                  local_164 = srcLshift;
                  while (local_164 = local_164 + -1, -1 < local_164) {
                    *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 3:
                  local_164 = srcLshift;
                  while (local_164 = local_164 + -1, -1 < local_164) {
                    *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                }
              }
              else {
                switch(local_210) {
                case 0:
                  local_168 = srcLshift;
                  while (local_168 = local_168 + -1, -1 < local_168) {
                    *src32addr = *_savedS;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 1:
                  local_168 = srcLshift;
                  while (local_168 = local_168 + -1, -1 < local_168) {
                    *src32addr = *_savedS & *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 2:
                  local_168 = srcLshift;
                  while (local_168 = local_168 + -1, -1 < local_168) {
                    *src32addr = *_savedS | *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                  break;
                case 3:
                  local_168 = srcLshift;
                  while (local_168 = local_168 + -1, -1 < local_168) {
                    *src32addr = *_savedS ^ *src32addr;
                    _savedS = _savedS + -1;
                    src32addr = src32addr + -1;
                  }
                }
              }
            }
            else if (bVar17) {
              switch(local_210) {
              case 0:
                local_16c = srcLshift;
                while (local_16c = local_16c + -1, -1 < local_16c) {
                  uVar9 = srcRshift | *_savedS << sVar14;
                  srcRshift = *_savedS >> sVar13;
                  *src32addr = uVar9 ^ 0xffffffff;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_16c = srcLshift;
                while (local_16c = local_16c + -1, -1 < local_16c) {
                  uVar9 = srcRshift | *_savedS << sVar14;
                  srcRshift = *_savedS >> sVar13;
                  *src32addr = (uVar9 ^ 0xffffffff) & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_16c = srcLshift;
                while (local_16c = local_16c + -1, -1 < local_16c) {
                  uVar9 = srcRshift | *_savedS << sVar14;
                  srcRshift = *_savedS >> sVar13;
                  *src32addr = uVar9 ^ 0xffffffff | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_16c = srcLshift;
                while (local_16c = local_16c + -1, -1 < local_16c) {
                  uVar9 = srcRshift | *_savedS << sVar14;
                  srcRshift = *_savedS >> sVar13;
                  *src32addr = uVar9 ^ 0xffffffff ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            else {
              switch(local_210) {
              case 0:
                local_170 = srcLshift;
                while (local_170 = local_170 + -1, -1 < local_170) {
                  uVar9 = srcRshift | *_savedS << sVar14;
                  srcRshift = *_savedS >> sVar13;
                  *src32addr = uVar9;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_170 = srcLshift;
                while (local_170 = local_170 + -1, -1 < local_170) {
                  uVar9 = srcRshift | *_savedS << sVar14;
                  srcRshift = *_savedS >> sVar13;
                  *src32addr = uVar9 & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_170 = srcLshift;
                while (local_170 = local_170 + -1, -1 < local_170) {
                  uVar9 = srcRshift | *_savedS << sVar14;
                  srcRshift = *_savedS >> sVar13;
                  *src32addr = uVar9 | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_170 = srcLshift;
                while (local_170 = local_170 + -1, -1 < local_170) {
                  uVar9 = srcRshift | *_savedS << sVar14;
                  srcRshift = *_savedS >> sVar13;
                  *src32addr = uVar9 ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            if (dstold == 0) goto LAB_00114794;
            if ((uint)dst32lbit < dstold) {
              newS = srcRshift;
            }
            else {
              newS = srcRshift | *_savedS << sVar14;
            }
            if (bVar17) {
              newS = newS ^ 0xffffffff;
            }
            x32byta._0_4_ = dst32addr._4_4_;
          }
LAB_001146ca:
          x32byta._4_4_ = *src32addr;
          uVar9 = x32byta._4_4_ & ~(uint)x32byta;
          switch(local_210) {
          case 0:
            x32byta._4_4_ = newS;
            break;
          case 1:
            x32byta._4_4_ = newS & x32byta._4_4_;
            break;
          case 2:
            x32byta._4_4_ = newS | x32byta._4_4_;
            break;
          case 3:
            x32byta._4_4_ = newS ^ x32byta._4_4_;
          }
          *src32addr = uVar9 | (uint)x32byta & x32byta._4_4_;
        }
        else {
          if ((dstold < (uint)dst32lbit) && (0x20 < dst32lbit + w)) {
            _savedS = OrigDstAddr + 2;
            newS = *OrigDstAddr << sVar14 | OrigDstAddr[1] >> sVar13 & dstdata;
            srcRshift = OrigDstAddr[1] << sVar14 & (dstdata ^ 0xffffffff);
          }
          else {
            if (dstold < (uint)dst32lbit) {
              newS = *OrigDstAddr << sVar14;
            }
            else {
              newS = *OrigDstAddr >> sVar13 & dstdata;
              srcRshift = *OrigDstAddr << sVar14 & (dstdata ^ 0xffffffff);
            }
            _savedS = OrigDstAddr + 1;
          }
          if (bVar17) {
            newS = newS ^ 0xffffffff;
          }
          if ((int)(dstold + w) < 0x21) {
            x32byta._0_4_ = (uint)dst32addr;
            goto LAB_001146ca;
          }
          x32byta._4_4_ = *_preloop_mask;
          uVar9 = x32byta._4_4_ & ~sdw_mask;
          switch(local_210) {
          case 0:
            x32byta._4_4_ = newS;
            break;
          case 1:
            x32byta._4_4_ = newS & x32byta._4_4_;
            break;
          case 2:
            x32byta._4_4_ = newS | x32byta._4_4_;
            break;
          case 3:
            x32byta._4_4_ = newS ^ x32byta._4_4_;
          }
          *_preloop_mask = uVar9 | sdw_mask & x32byta._4_4_;
          src32addr = _preloop_mask + 1;
          if (dst32lbit == dstold) {
            if (bVar17) {
              switch(local_210) {
              case 0:
                local_154 = srcLshift;
                while (local_154 = local_154 + -1, -1 < local_154) {
                  *src32addr = *_savedS ^ 0xffffffff;
                  _savedS = _savedS + 1;
                  src32addr = src32addr + 1;
                }
                break;
              case 1:
                local_154 = srcLshift;
                while (local_154 = local_154 + -1, -1 < local_154) {
                  *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                  _savedS = _savedS + 1;
                  src32addr = src32addr + 1;
                }
                break;
              case 2:
                local_154 = srcLshift;
                while (local_154 = local_154 + -1, -1 < local_154) {
                  *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                  _savedS = _savedS + 1;
                  src32addr = src32addr + 1;
                }
                break;
              case 3:
                local_154 = srcLshift;
                while (local_154 = local_154 + -1, -1 < local_154) {
                  *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                  _savedS = _savedS + 1;
                  src32addr = src32addr + 1;
                }
              }
            }
            else {
              switch(local_210) {
              case 0:
                local_158 = srcLshift;
                while (local_158 = local_158 + -1, -1 < local_158) {
                  *src32addr = *_savedS;
                  _savedS = _savedS + 1;
                  src32addr = src32addr + 1;
                }
                break;
              case 1:
                local_158 = srcLshift;
                while (local_158 = local_158 + -1, -1 < local_158) {
                  *src32addr = *_savedS & *src32addr;
                  _savedS = _savedS + 1;
                  src32addr = src32addr + 1;
                }
                break;
              case 2:
                local_158 = srcLshift;
                while (local_158 = local_158 + -1, -1 < local_158) {
                  *src32addr = *_savedS | *src32addr;
                  _savedS = _savedS + 1;
                  src32addr = src32addr + 1;
                }
                break;
              case 3:
                local_158 = srcLshift;
                while (local_158 = local_158 + -1, -1 < local_158) {
                  *src32addr = *_savedS ^ *src32addr;
                  _savedS = _savedS + 1;
                  src32addr = src32addr + 1;
                }
              }
            }
          }
          else if (bVar17) {
            switch(local_210) {
            case 0:
              local_15c = srcLshift;
              while (local_15c = local_15c + -1, -1 < local_15c) {
                uVar9 = srcRshift | *_savedS >> sVar13;
                srcRshift = *_savedS << sVar14;
                *src32addr = uVar9 ^ 0xffffffff;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_15c = srcLshift;
              while (local_15c = local_15c + -1, -1 < local_15c) {
                uVar9 = srcRshift | *_savedS >> sVar13;
                srcRshift = *_savedS << sVar14;
                *src32addr = (uVar9 ^ 0xffffffff) & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_15c = srcLshift;
              while (local_15c = local_15c + -1, -1 < local_15c) {
                uVar9 = srcRshift | *_savedS >> sVar13;
                srcRshift = *_savedS << sVar14;
                *src32addr = uVar9 ^ 0xffffffff | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_15c = srcLshift;
              while (local_15c = local_15c + -1, -1 < local_15c) {
                uVar9 = srcRshift | *_savedS >> sVar13;
                srcRshift = *_savedS << sVar14;
                *src32addr = uVar9 ^ 0xffffffff ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
          else {
            switch(local_210) {
            case 0:
              local_160 = srcLshift;
              while (local_160 = local_160 + -1, -1 < local_160) {
                uVar9 = srcRshift | *_savedS >> sVar13;
                srcRshift = *_savedS << sVar14;
                *src32addr = uVar9;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 1:
              local_160 = srcLshift;
              while (local_160 = local_160 + -1, -1 < local_160) {
                uVar9 = srcRshift | *_savedS >> sVar13;
                srcRshift = *_savedS << sVar14;
                *src32addr = uVar9 & *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 2:
              local_160 = srcLshift;
              while (local_160 = local_160 + -1, -1 < local_160) {
                uVar9 = srcRshift | *_savedS >> sVar13;
                srcRshift = *_savedS << sVar14;
                *src32addr = uVar9 | *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
              break;
            case 3:
              local_160 = srcLshift;
              while (local_160 = local_160 + -1, -1 < local_160) {
                uVar9 = srcRshift | *_savedS >> sVar13;
                srcRshift = *_savedS << sVar14;
                *src32addr = uVar9 ^ *src32addr;
                _savedS = _savedS + 1;
                src32addr = src32addr + 1;
              }
            }
          }
          if (fwd != 0x1f) {
            if ((uint)fwd < OrigSrcAddr._4_4_) {
              newS = srcRshift;
            }
            else {
              newS = srcRshift | *_savedS >> sVar13 & dstdata;
            }
            if (bVar17) {
              newS = newS ^ 0xffffffff;
            }
            x32byta._0_4_ = dst32addr._4_4_;
            goto LAB_001146ca;
          }
        }
LAB_00114794:
        iVar8 = src_comp >> 5;
        iVar15 = op >> 5;
        if (bVar4) {
          if (bVar18) {
            uVar9 = src_comp + fwd;
            if ((int)uVar9 < 0) {
              lVar16 = (long)((int)(0x1f - uVar9) >> 5) * -4;
            }
            else {
              lVar16 = (long)((int)dstold >> 5) * 4;
            }
            fwd = uVar9 & 0x1f;
            dstold = (fwd - w) + 1U & 0x1f;
            sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
            if (dstold == 0) {
              local_28c = 0xffffffff;
            }
            else {
              local_28c = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
            }
            dst32addr._4_4_ = local_28c;
            dst32addr._0_4_ = sdw_mask & local_28c;
            if ((w - fwd) + -1 < 1) {
              local_290 = 0;
            }
            else {
              local_290 = (w - fwd) + -1 >> 5;
            }
            srcLshift = local_290;
          }
          else {
            lVar16 = (long)iVar8 * 4;
          }
          src32addr = (uint *)((long)_preloop_mask + lVar16);
          if (bVar18) {
            uVar9 = op + OrigSrcAddr._4_4_;
            if ((int)uVar9 < 0) {
              lVar16 = (long)((int)(0x1f - uVar9) >> 5) * -4;
            }
            else {
              lVar16 = (long)((int)uVar9 >> 5) * 4;
            }
            OrigSrcAddr._4_4_ = uVar9 & 0x1f;
            dst32lbit = (OrigSrcAddr._4_4_ - w) + 1 & 0x1f;
            local_150 = dstold - dst32lbit & 0x1f;
            srcRmask = dst32lbit - dstold & 0x1f;
            if (srcRmask == 0) {
              local_294 = 0;
            }
            else {
              local_294 = -1 << (sbyte)srcRmask ^ 0xffffffff;
            }
            dstdata = local_294;
          }
          else {
            lVar16 = (long)iVar15 * 4;
          }
          _savedS = (uint *)((long)OrigDstAddr + lVar16);
          _preloop_mask = src32addr;
          OrigDstAddr = _savedS;
          src32lbit = src32lbit + -1;
        }
        else {
          if (bVar18) {
            iVar8 = (int)(src_comp + dstold) >> 5;
            dstold = src_comp + dstold & 0x1f;
            fwd = (dstold + w) - 1 & 0x1f;
            if (dstold == 0) {
              local_284 = 0xffffffff;
            }
            else {
              local_284 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
            }
            sdw_mask = local_284;
            dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
            dst32addr._0_4_ = local_284 & dst32addr._4_4_;
            srcLshift = ((int)(dstold + w) >> 5) + -1;
          }
          _preloop_mask = _preloop_mask + iVar8;
          if (bVar18) {
            iVar15 = op + dst32lbit >> 5;
            dst32lbit = op + dst32lbit & 0x1f;
            OrigSrcAddr._4_4_ = (dst32lbit + w) - 1U & 0x1f;
            local_150 = dstold - dst32lbit & 0x1f;
            srcRmask = dst32lbit - dstold & 0x1f;
            if (srcRmask == 0) {
              local_288 = 0xffffffff;
            }
            else {
              local_288 = -1 << (sbyte)srcRmask ^ 0xffffffff;
            }
            dstdata = local_288;
          }
          OrigDstAddr = OrigDstAddr + iVar15;
          src32lbit = src32lbit + -1;
        }
      }
      if ((DisplayRegion68k <= _dty) && (_dty <= DISP_MAX_Address)) {
        flush_display_region(x,iVar7,w,local_1dc);
      }
      ScreenLocked = 0;
      args_local._4_4_ = 0x4c;
    }
    else {
      args_local._4_4_ = 0;
    }
  }
  else {
    if ((args[1] & 0xfff0000) == 0xf0000) {
      dleft = args[1] | 0xffff0000;
      goto LAB_00111b98;
    }
    if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) == 2) {
      pLVar12 = NativeAligned4FromLAddr(args[1]);
      dleft = *pLVar12;
      goto LAB_00111b98;
    }
LAB_00114d20:
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR bitblt_bitmap(LispPTR *args) {
  BITMAP *SourceBitmap, *DestBitmap;
  int sleft, sbottom, dleft, dbottom, width, height, clipleft, clipbottom;
  LispPTR clipreg;
  int stodx, stody, right, top, destbits, sourcebits, left, bottom;
  LispPTR sourcetype, operation, texture;
  DLword *srcbase, *dstbase;
  int dlx, dty, slx, sty, srcbpl, dstbpl, op, src_comp, backwardflg = 0, displayflg = 0;

#ifdef INIT
  init_kbd_startup;
#endif

  /* Get arguments  and check the possibilities of PUNT */
  SourceBitmap = (BITMAP *)NativeAligned4FromLAddr(args[0]);
  DestBitmap = (BITMAP *)NativeAligned4FromLAddr(args[3]);
  /* It does not handle COLOR ..... maybe later */
  destbits = DestBitmap->bmbitperpixel;
  sourcebits = SourceBitmap->bmbitperpixel;
  if ((destbits != 1) || (sourcebits != 1)) {
    PUNT_TO_BITBLTBITMAP;
  }
  sourcetype = args[8];
  /* sourcetype == MERGE_atom case must be handled in Lisp function \\PUNT.BITBLT.BITMAP */
  if (sourcetype == MERGE_atom) { PUNT_TO_BITBLTBITMAP; }

  N_GETNUMBER(args[1], sleft, bad_arg);
  N_GETNUMBER(args[2], sbottom, bad_arg);
  N_GETNUMBER(args[4], dleft, bad_arg);
  N_GETNUMBER(args[5], dbottom, bad_arg);
  N_GETNUMBER(args[6], width, bad_arg);
  N_GETNUMBER(args[7], height, bad_arg);
  operation = args[9];
  texture = args[10];
  clipreg = args[11];
  N_GETNUMBER(args[12], clipleft, bad_arg);
  N_GETNUMBER(args[13], clipbottom, bad_arg);

  left = bottom = 0;
  top = DestBitmap->bmheight;
  right = DestBitmap->bmwidth;

  if (clipreg != NIL_PTR) {
    /* clip the BITBLT using the clipping region supplied */
    LispPTR clipvalue;
    int temp, cr_left, cr_bot;

    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, cr_left, bad_arg);
    left = max(left, cr_left);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, cr_bot, bad_arg);
    bottom = max(bottom, cr_bot);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, temp, bad_arg);
    right = min(right, cr_left + temp);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, temp, bad_arg);
    top = min(top, cr_bot + temp);
  }

  left = max(left, dleft);
  right = min(right, dleft + width);
  bottom = max(bottom, dbottom);
  top = min(top, dbottom + height);
  stody = dbottom - sbottom;
  stodx = dleft - sleft;

  {
    int temp;
    left = max(clipleft, max(0, left - stodx));
    bottom = max(clipbottom, max(0, bottom - stody));
    temp = SourceBitmap->bmwidth;
    right = min(temp, min(right - stodx, clipleft + width));
    temp = SourceBitmap->bmheight;
    top = min(temp, min(top - stody, clipbottom + height));
  }

  if ((right <= left) || (top <= bottom)) return (NIL);

  /*** PUT SOURCETYPE MERGE special code HERE ***/
  /**** See above, earlier in this code check sourcetype and punting. *****/
  /**** sourcebits CANNOT be unequal to destbits from earlier check */

  if (sourcebits != destbits) {
    /* DBPRINT(("BITBLT between bitmaps of different sizes, unimplemented.")); */
      return NIL;
  }
  /* if not 1-bit-per-pixel adjust limits by pixel size */
  switch (sourcebits) {
  case 1:
      break;
  case 4:
      left = left * 4;
      right = right * 4;
      stodx = stodx * 4;
      /* Put color texture merge case here */
      break;

  case 8:
      left = left * 8;
      right = right * 8;
      stodx = stodx * 8;
      /* Put color texture merge case here */
      break;

  case 24:
      left = left * 24;
      right = right * 24;
      stodx = stodx * 24;
      /* Put color texture merge case here */
      break;
  }

  height = top - bottom;
  width = right - left;
  dty = DestBitmap->bmheight - (top + stody);
  dlx = left + stodx;
  sty = SourceBitmap->bmheight - top;
  slx = left;

  /*** Stolen from bitbltsub, to avoid the call overhead: ***/
  src_comp = bbsrc_type(sourcetype, operation);
  op = bbop(sourcetype, operation);

  dstbpl = DestBitmap->bmrasterwidth << 4;

  /* Sourcetype guaranteed not to be TEXTURE by BITBLT fn */
  srcbpl = SourceBitmap->bmrasterwidth << 4;

  /* compute flags */
  if (SourceBitmap != DestBitmap)
    ;
  else if (sty > dty)
    ;
  else if (dty > (sty + height))
    ;
  else if ((sty != dty) || ((slx < dlx) && (dlx < (slx + width))))
    backwardflg = T;

  if (backwardflg) {
    srcbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(SourceBitmap->bmbase, SourceBitmap->bmrasterwidth * (sty + height - 1)));
    dstbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(DestBitmap->bmbase, DestBitmap->bmrasterwidth * (dty + height - 1)));
    srcbpl = 0 - srcbpl;
    dstbpl = 0 - dstbpl;
  } else {
    srcbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(SourceBitmap->bmbase, SourceBitmap->bmrasterwidth * sty));
    dstbase =
        (DLword *)NativeAligned2FromLAddr(ADDBASE(DestBitmap->bmbase, DestBitmap->bmrasterwidth * dty));
  }

  displayflg = n_new_cursorin(srcbase, slx, sty, width, height);

do_it_now:
  LOCKSCREEN;

#ifdef REALCURSOR
  displayflg |= n_new_cursorin(dstbase, dlx, dty, width, height);
  if (displayflg) HideCursor;
#endif /*  REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, slx, dlx, width, height, srcbpl, dstbpl, backwardflg, src_comp, op, 0, 0,
         0);
#else
#define gray 0
#define dx dlx
#define sx slx
#define w width
#define h height
#define curr_gray_line dx
#define num_gray 0
  new_bitblt_code;
#undef gray
#undef dx
#undef sx
#undef w
#undef h
#undef curr_gray_line
#undef num_gray
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    /* Copy the changed section of display bank to the frame buffer */
    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dlx, dty, width,height));*/
      flush_display_region(dlx, dty, width, height);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_region(dlx, dty, width, height);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_region(dlx, dty, width, height);
#endif /* SDL */

#ifdef DOS
  /* Copy the changed section of display bank to the frame buffer */
  if (in_display_segment(dstbase)) {
    /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
    flush_display_region(dlx, dty, width, height);
  }
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;

  return (ATOM_T);

bad_arg:
  return (NIL);
}